

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void mkgrave(level *lev,mkroom *croom)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  obj *otmp_00;
  char *str;
  bool bVar4;
  boolean dobell;
  obj *otmp;
  int tryct;
  coord m;
  mkroom *croom_local;
  level *lev_local;
  
  otmp._0_4_ = 0;
  _tryct = croom;
  iVar2 = rn2(10);
  if (_tryct->rtype == '\0') {
    do {
      otmp._0_4_ = (int)otmp + 1;
      if (200 < (int)otmp) {
        return;
      }
      bVar1 = somexy(lev,_tryct,(coord *)((long)&otmp + 6));
      if (bVar1 == '\0') {
        return;
      }
      bVar1 = occupied(lev,otmp._6_1_,otmp._7_1_);
      bVar4 = true;
      if (bVar1 == '\0') {
        bVar1 = bydoor(lev,otmp._6_1_,otmp._7_1_);
        bVar4 = bVar1 != '\0';
      }
    } while (bVar4);
    str = (char *)0x0;
    if (iVar2 == 0) {
      str = "Saved by the bell!";
    }
    make_grave(lev,(int)otmp._6_1_,(int)otmp._7_1_,str);
    iVar3 = rn2(3);
    if (iVar3 == 0) {
      mkgold(0,lev,(int)otmp._6_1_,(int)otmp._7_1_);
    }
    for (otmp._0_4_ = rn2(5); (int)otmp != 0; otmp._0_4_ = (int)otmp + -1) {
      otmp_00 = mkobj(lev,'\0','\x01');
      if (otmp_00 == (obj *)0x0) {
        return;
      }
      curse(otmp_00);
      otmp_00->ox = otmp._6_1_;
      otmp_00->oy = otmp._7_1_;
      add_to_buried(otmp_00);
    }
    if (iVar2 == 0) {
      mksobj_at(0x104,lev,(int)otmp._6_1_,(int)otmp._7_1_,'\x01','\0');
    }
  }
  return;
}

Assistant:

static void mkgrave(struct level *lev, struct mkroom *croom)
{
	coord m;
	int tryct = 0;
	struct obj *otmp;
	boolean dobell = !rn2(10);


	if (croom->rtype != OROOM) return;

	do {
	    if (++tryct > 200) return;
	    if (!somexy(lev, croom, &m))
		return;
	} while (occupied(lev, m.x, m.y) || bydoor(lev, m.x, m.y));

	/* Put a grave at m.x, m.y */
	make_grave(lev, m.x, m.y, dobell ? "Saved by the bell!" : NULL);

	/* Possibly fill it with objects */
	if (!rn2(3)) mkgold(0L, lev, m.x, m.y);
	for (tryct = rn2(5); tryct; tryct--) {
	    otmp = mkobj(lev, RANDOM_CLASS, TRUE);
	    if (!otmp) return;
	    curse(otmp);
	    otmp->ox = m.x;
	    otmp->oy = m.y;
	    add_to_buried(otmp);
	}

	/* Leave a bell, in case we accidentally buried someone alive */
	if (dobell) mksobj_at(BELL, lev, m.x, m.y, TRUE, FALSE);
	return;
}